

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O3

void __thiscall SmallArray<DelayedType,_32U>::~SmallArray(SmallArray<DelayedType,_32U> *this)

{
  DelayedType *pDVar1;
  
  pDVar1 = this->data;
  if (pDVar1 != this->little) {
    if (this->allocator == (Allocator *)0x0) {
      if (pDVar1 != (DelayedType *)0x0) {
        (*(code *)NULLC::dealloc)(pDVar1);
      }
    }
    else if (pDVar1 != (DelayedType *)0x0) {
      (*this->allocator->_vptr_Allocator[3])();
    }
  }
  return;
}

Assistant:

~SmallArray()
	{
		if(data != little)
		{
			if(allocator)
				allocator->destruct(data, max);
			else
				NULLC::destruct(data, max);
		}
	}